

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void sqlite3CompleteInsertion
               (Parse *pParse,Table *pTab,int baseCur,int regRowid,int *aRegIdx,int isUpdate,
               int appendBias,int useSeekResult)

{
  byte bVar1;
  int p3;
  Vdbe *p;
  Index **ppIVar2;
  byte bVar3;
  long lVar4;
  
  p = sqlite3GetVdbe(pParse);
  lVar4 = 0;
  for (ppIVar2 = &pTab->pIndex; *ppIVar2 != (Index *)0x0; ppIVar2 = &(*ppIVar2)->pNext) {
    lVar4 = lVar4 + 1;
  }
  for (; 0 < lVar4; lVar4 = lVar4 + -1) {
    if (((aRegIdx[lVar4 + -1] != 0) &&
        (sqlite3VdbeAddOp2(p,0x61,(int)lVar4 + baseCur,aRegIdx[lVar4 + -1]), useSeekResult != 0)) &&
       (p->aOp != (Op *)0x0)) {
      p->aOp[(long)p->nOp + -1].p5 = '\x10';
    }
  }
  p3 = sqlite3GetTempReg(pParse);
  sqlite3VdbeAddOp3(p,0x1f,regRowid + 1,(int)pTab->nCol,p3);
  sqlite3TableAffinityStr(p,pTab);
  sqlite3ExprCacheRemove(pParse,regRowid + 1,(int)pTab->nCol);
  bVar1 = (isUpdate != 0) * '\x02' + 3;
  if (pParse->nested != '\0') {
    bVar1 = 0;
  }
  bVar3 = bVar1 + 8;
  if (appendBias == 0) {
    bVar3 = bVar1;
  }
  bVar1 = bVar3 | 0x10;
  if (useSeekResult == 0) {
    bVar1 = bVar3;
  }
  sqlite3VdbeAddOp3(p,0x39,baseCur,p3,regRowid);
  if (pParse->nested == '\0') {
    sqlite3VdbeChangeP4(p,-1,pTab->zName,0);
  }
  if (p->aOp != (Op *)0x0) {
    p->aOp[(long)p->nOp + -1].p5 = bVar1;
  }
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3CompleteInsertion(
  Parse *pParse,      /* The parser context */
  Table *pTab,        /* the table into which we are inserting */
  int baseCur,        /* Index of a read/write cursor pointing at pTab */
  int regRowid,       /* Range of content */
  int *aRegIdx,       /* Register used by each index.  0 for unused indices */
  int isUpdate,       /* True for UPDATE, False for INSERT */
  int appendBias,     /* True if this is likely to be an append */
  int useSeekResult   /* True to set the USESEEKRESULT flag on OP_[Idx]Insert */
){
  int i;
  Vdbe *v;
  int nIdx;
  Index *pIdx;
  u8 pik_flags;
  int regData;
  int regRec;

  v = sqlite3GetVdbe(pParse);
  assert( v!=0 );
  assert( pTab->pSelect==0 );  /* This table is not a VIEW */
  for(nIdx=0, pIdx=pTab->pIndex; pIdx; pIdx=pIdx->pNext, nIdx++){}
  for(i=nIdx-1; i>=0; i--){
    if( aRegIdx[i]==0 ) continue;
    sqlite3VdbeAddOp2(v, OP_IdxInsert, baseCur+i+1, aRegIdx[i]);
    if( useSeekResult ){
      sqlite3VdbeChangeP5(v, OPFLAG_USESEEKRESULT);
    }
  }
  regData = regRowid + 1;
  regRec = sqlite3GetTempReg(pParse);
  sqlite3VdbeAddOp3(v, OP_MakeRecord, regData, pTab->nCol, regRec);
  sqlite3TableAffinityStr(v, pTab);
  sqlite3ExprCacheAffinityChange(pParse, regData, pTab->nCol);
  if( pParse->nested ){
    pik_flags = 0;
  }else{
    pik_flags = OPFLAG_NCHANGE;
    pik_flags |= (isUpdate?OPFLAG_ISUPDATE:OPFLAG_LASTROWID);
  }
  if( appendBias ){
    pik_flags |= OPFLAG_APPEND;
  }
  if( useSeekResult ){
    pik_flags |= OPFLAG_USESEEKRESULT;
  }
  sqlite3VdbeAddOp3(v, OP_Insert, baseCur, regRec, regRowid);
  if( !pParse->nested ){
    sqlite3VdbeChangeP4(v, -1, pTab->zName, P4_TRANSIENT);
  }
  sqlite3VdbeChangeP5(v, pik_flags);
}